

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

ArrayBuilder<char32_t> * __thiscall
kj::ArrayBuilder<char32_t>::operator=(ArrayBuilder<char32_t> *this,ArrayBuilder<char32_t> *other)

{
  char32_t *pcVar1;
  RemoveConst<char32_t> *pRVar2;
  char32_t *pcVar3;
  
  pcVar1 = this->ptr;
  if (pcVar1 != (char32_t *)0x0) {
    pRVar2 = this->pos;
    pcVar3 = this->endPtr;
    this->ptr = (char32_t *)0x0;
    this->pos = (RemoveConst<char32_t> *)0x0;
    this->endPtr = (char32_t *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pcVar1,4,(long)pRVar2 - (long)pcVar1 >> 2,
               (long)pcVar3 - (long)pcVar1 >> 2,0);
  }
  this->ptr = other->ptr;
  this->pos = other->pos;
  this->endPtr = other->endPtr;
  this->disposer = other->disposer;
  other->ptr = (char32_t *)0x0;
  other->pos = (RemoveConst<char32_t> *)0x0;
  other->endPtr = (char32_t *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }